

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_getfenv(lua_State *L,int idx)

{
  TValue *pTVar1;
  cTValue *o;
  int idx_local;
  lua_State *L_local;
  TValue *o_1;
  
  pTVar1 = index2adr(L,idx);
  if ((int)(pTVar1->field_4).it >> 0xf == -9) {
    L->top->u64 = *(ulong *)((pTVar1->u64 & 0x7fffffffffff) + 0x10) | 0xfffa000000000000;
  }
  else if ((int)(pTVar1->field_4).it >> 0xf == -0xd) {
    L->top->u64 = *(ulong *)((pTVar1->u64 & 0x7fffffffffff) + 0x10) | 0xfffa000000000000;
  }
  else if ((int)(pTVar1->field_4).it >> 0xf == -7) {
    L->top->u64 = *(ulong *)((pTVar1->u64 & 0x7fffffffffff) + 0x48) | 0xfffa000000000000;
  }
  else {
    L->top->u64 = 0xffffffffffffffff;
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return;
}

Assistant:

LUA_API void lua_getfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  if (tvisfunc(o)) {
    settabV(L, L->top, tabref(funcV(o)->c.env));
  } else if (tvisudata(o)) {
    settabV(L, L->top, tabref(udataV(o)->env));
  } else if (tvisthread(o)) {
    settabV(L, L->top, tabref(threadV(o)->env));
  } else {
    setnilV(L->top);
  }
  incr_top(L);
}